

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_encoder_factory.h
# Opt level: O3

unique_ptr<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
 __thiscall
draco::
CreatePredictionSchemeForEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>
          (draco *this,PredictionSchemeMethod method,int att_id,PointCloudEncoder *encoder,
          PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int> *transform)

{
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *puVar4;
  MeshEncoder *mesh_encoder;
  
  _Var1._M_t.
  super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
  super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
       (encoder->point_cloud_->attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[att_id]._M_t.
       super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
       _M_t;
  if (method == PREDICTION_UNDEFINED) {
    method = SelectPredictionMethod(att_id,encoder);
  }
  if (method == PREDICTION_NONE) {
    puVar4 = (undefined8 *)0x0;
  }
  else {
    iVar3 = (*encoder->_vptr_PointCloudEncoder[2])(encoder);
    if ((iVar3 == 1) &&
       (CreateMeshPredictionScheme<draco::MeshEncoder,draco::PredictionSchemeEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>,draco::MeshPredictionSchemeEncoderFactory<int>>
                  (this,(MeshEncoder *)encoder,method,att_id,transform,0x202), *(long *)this != 0))
    {
      return (__uniq_ptr_data<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>,_true,_true>
              )(__uniq_ptr_data<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>,_true,_true>
                )this;
    }
    puVar4 = (undefined8 *)operator_new(0x28);
    ((tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_> *)(puVar4 + 1))->
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_> =
         (_Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
         _Var1._M_t.
         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl;
    uVar2 = *(undefined8 *)
             &(transform->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
              super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
              max_value_;
    puVar4[2] = *(undefined8 *)
                 &(transform->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>)
                  .super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_;
    puVar4[3] = uVar2;
    *(int32_t *)(puVar4 + 4) =
         (transform->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
         super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.center_value_
    ;
    *puVar4 = &PTR__PredictionSchemeInterface_001de8f8;
  }
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PredictionSchemeEncoder<DataTypeT, TransformT>>
CreatePredictionSchemeForEncoder(PredictionSchemeMethod method, int att_id,
                                 const PointCloudEncoder *encoder,
                                 const TransformT &transform) {
  const PointAttribute *const att = encoder->point_cloud()->attribute(att_id);
  if (method == PREDICTION_UNDEFINED) {
    method = SelectPredictionMethod(att_id, encoder);
  }
  if (method == PREDICTION_NONE) {
    return nullptr;  // No prediction is used.
  }
  if (encoder->GetGeometryType() == TRIANGULAR_MESH) {
    // Cast the encoder to mesh encoder. This is not necessarily safe if there
    // is some other encoder decides to use TRIANGULAR_MESH as the return type,
    // but unfortunately there is not nice work around for this without using
    // RTTI (double dispatch and similar concepts will not work because of the
    // template nature of the prediction schemes).
    const MeshEncoder *const mesh_encoder =
        static_cast<const MeshEncoder *>(encoder);
    const uint16_t bitstream_version = kDracoMeshBitstreamVersion;
    auto ret = CreateMeshPredictionScheme<
        MeshEncoder, PredictionSchemeEncoder<DataTypeT, TransformT>,
        MeshPredictionSchemeEncoderFactory<DataTypeT>>(
        mesh_encoder, method, att_id, transform, bitstream_version);
    if (ret) {
      return ret;
    }
    // Otherwise try to create another prediction scheme.
  }
  // Create delta encoder.
  return std::unique_ptr<PredictionSchemeEncoder<DataTypeT, TransformT>>(
      new PredictionSchemeDeltaEncoder<DataTypeT, TransformT>(att, transform));
}